

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carray.hpp
# Opt level: O0

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<char[12],void>::operator()
          (pack<char[12],_void> *this,packer<msgpack::v1::sbuffer> *o,char (*v) [12])

{
  uint32_t l;
  void *pvVar1;
  packer<msgpack::v1::sbuffer> *in_RDX;
  packer<msgpack::v1::sbuffer> *in_RSI;
  uint32_t adjusted_size;
  char *p2;
  uint32_t size;
  char *p;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t l_00;
  
  l = checked_get_container_size<unsigned_long>(0x204357);
  pvVar1 = memchr(in_RDX,0,(ulong)l);
  l_00 = (uint32_t)((ulong)pvVar1 >> 0x20);
  packer<msgpack::v1::sbuffer>::pack_str(in_RDX,l);
  packer<msgpack::v1::sbuffer>::pack_str_body
            (in_RDX,(char *)CONCAT44(l,in_stack_ffffffffffffffd8),l_00);
  return in_RSI;
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const char(&v)[N]) const {
        char const* p = v;
        uint32_t size = checked_get_container_size(N);
        char const* p2 = static_cast<char const*>(std::memchr(p, '\0', size));
        uint32_t adjusted_size = p2 ? static_cast<uint32_t>(p2 - p) : size;
        o.pack_str(adjusted_size);
        o.pack_str_body(p, adjusted_size);
        return o;
    }